

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_0::IsIndexInHasBitSet
               (uint32 *has_bit_set,uint32 has_bit_index)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (has_bit_index == 0xffffffff) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,1000);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (has_bit_index) != (~0u): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  return (has_bit_set[has_bit_index >> 5] >> (has_bit_index & 0x1f) & 1) != 0;
}

Assistant:

inline bool IsIndexInHasBitSet(
    const uint32* has_bit_set, uint32 has_bit_index) {
  GOOGLE_DCHECK_NE(has_bit_index, ~0u);
  return ((has_bit_set[has_bit_index / 32] >> (has_bit_index % 32)) &
          static_cast<uint32>(1)) != 0;
}